

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliY.cpp
# Opt level: O0

void __thiscall
qclab::qgates::PauliY<std::complex<float>_>::apply
          (PauliY<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  complex<float> *pcVar2;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector_00;
  undefined1 local_40 [8];
  anon_class_24_3_f49331b9 f;
  int qubit;
  int offset_local;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  PauliY<std::complex<float>_> *this_local;
  
  vector_00 = vector;
  f.lambda2._M_value._4_4_ = offset;
  iVar1 = (*(this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[3])();
  f.lambda2._M_value._0_4_ = iVar1 + f.lambda2._M_value._4_4_;
  pcVar2 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data(vector);
  lambda_PauliY<std::complex<float>>
            ((anon_class_24_3_f49331b9 *)local_40,(qgates *)(ulong)(uint)(int)(char)op,(Op)pcVar2,
             (complex<float> *)vector_00);
  apply2<qclab::qgates::lambda_PauliY<std::complex<float>>(qclab::Op,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,(int)f.lambda2._M_value,(anon_class_24_3_f49331b9 *)local_40);
  return;
}

Assistant:

void PauliY< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_PauliY( op , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }